

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_start_str_notrack(mpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t count_local;
  mpack_writer_t *writer_local;
  
  if (count < 0x20) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((sVar2 != 0) || (_Var1 = mpack_writer_ensure(writer,1), _Var1)) {
      mpack_encode_fixstr(writer->current,(uint8_t)count);
      writer->current = writer->current + 1;
    }
  }
  else if ((count < 0x100) && (mpack_version_v4 < writer->version)) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
      mpack_encode_str8(writer->current,(uint8_t)count);
      writer->current = writer->current + 2;
    }
  }
  else if (count < 0x10000) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((2 < sVar2) || (_Var1 = mpack_writer_ensure(writer,3), _Var1)) {
      mpack_encode_str16(writer->current,(uint16_t)count);
      writer->current = writer->current + 3;
    }
  }
  else {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((4 < sVar2) || (_Var1 = mpack_writer_ensure(writer,5), _Var1)) {
      mpack_encode_str32(writer->current,count);
      writer->current = writer->current + 5;
    }
  }
  return;
}

Assistant:

static void mpack_start_str_notrack(mpack_writer_t* writer, uint32_t count) {
    if (count <= 31) {
        MPACK_WRITE_ENCODED(mpack_encode_fixstr, MPACK_TAG_SIZE_FIXSTR, (uint8_t)count);

    // str8 is only supported in v5 or later.
    } else if (count <= UINT8_MAX
            #if MPACK_COMPATIBILITY
            && writer->version >= mpack_version_v5
            #endif
            ) {
        MPACK_WRITE_ENCODED(mpack_encode_str8, MPACK_TAG_SIZE_STR8, (uint8_t)count);

    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_str16, MPACK_TAG_SIZE_STR16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_str32, MPACK_TAG_SIZE_STR32, (uint32_t)count);
    }
}